

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *pGia,Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  long *plVar2;
  char *pSop;
  long lVar3;
  Abc_Ntk_t *pNtk_00;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int gFanins [16];
  int local_78 [18];
  
  pvVar1 = pNtk->pData;
  lVar9 = (long)pNtk->vPis->nSize;
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      plVar2 = (long *)pNtk->vPis->pArray[lVar10];
      if (*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8)
                  + 0x40) < 0) {
        __assert_fail("Abc_ObjFanout0(pTerm)->iTemp >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xbd,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  if (0 < *(int *)((long)pvVar1 + 4)) {
    lVar9 = 0;
    do {
      plVar2 = *(long **)(*(long *)((long)pvVar1 + 8) + lVar9 * 8);
      uVar6 = *(uint *)((long)plVar2 + 0x14) & 0xf;
      if (uVar6 == 7) {
        iVar8 = *(int *)((long)plVar2 + 0x1c);
        if (0x10 < iVar8) {
          __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xdb,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
        pSop = (char *)plVar2[7];
        iVar7 = Abc_SopGetVarNum(pSop);
        if (iVar8 != iVar7) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xdc,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
        iVar8 = *(int *)((long)plVar2 + 0x1c);
        if (0 < (long)iVar8) {
          lVar10 = plVar2[4];
          lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
          lVar11 = 0;
          do {
            iVar7 = *(int *)(*(long *)(lVar3 + (long)*(int *)(lVar10 + lVar11 * 4) * 8) + 0x40);
            local_78[lVar11] = iVar7;
            if (iVar7 < 0) {
              __assert_fail("gFanins[k] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                            ,0xe0,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
            }
            lVar11 = lVar11 + 1;
          } while (iVar8 != lVar11);
        }
        iVar8 = Abc_NtkDeriveFlatGiaSop(pGia,local_78,pSop);
        *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
                0x40) = iVar8;
      }
      else {
        if (uVar6 != 10 && (*(uint *)((long)plVar2 + 0x14) & 0xe) != 8) {
          __assert_fail("Abc_ObjIsBox(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xe5,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
        pNtk_00 = (Abc_Ntk_t *)plVar2[7];
        Abc_NtkFillTemp(pNtk_00);
        if (*(int *)((long)plVar2 + 0x1c) != pNtk_00->vPis->nSize) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xe9,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
        if (*(int *)((long)plVar2 + 0x2c) != pNtk_00->vPos->nSize) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0xea,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
        }
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar10 = 0;
          do {
            if (pNtk_00->vPis->nSize <= lVar10) goto LAB_001d06b6;
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)(plVar2[4] + lVar10 * 4) * 8);
            plVar5 = (long *)pNtk_00->vPis->pArray[lVar10];
            *(undefined4 *)
             (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8) +
             0x40) = *(undefined4 *)
                      (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                (long)*(int *)plVar4[4] * 8) + 0x40);
            lVar10 = lVar10 + 1;
          } while (lVar10 < *(int *)((long)plVar2 + 0x1c));
        }
        Abc_NtkDeriveFlatGia_rec(pGia,pNtk_00);
        if (0 < *(int *)((long)plVar2 + 0x2c)) {
          lVar10 = 0;
          do {
            if (pNtk_00->vPos->nSize <= lVar10) {
LAB_001d06b6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)(plVar2[6] + lVar10 * 4) * 8);
            plVar5 = (long *)pNtk_00->vPos->pArray[lVar10];
            *(undefined4 *)
             (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8) +
             0x40) = *(undefined4 *)
                      (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                (long)*(int *)plVar5[4] * 8) + 0x40);
            lVar10 = lVar10 + 1;
          } while (lVar10 < *(int *)((long)plVar2 + 0x2c));
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)((long)pvVar1 + 4));
  }
  lVar9 = (long)pNtk->vPos->nSize;
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      plVar2 = (long *)pNtk->vPos->pArray[lVar10];
      if (*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8)
                  + 0x40) < 0) {
        __assert_fail("Abc_ObjFanin0(pTerm)->iTemp >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                      ,0xf5,"void Abc_NtkDeriveFlatGia_rec(Gia_Man_t *, Abc_Ntk_t *)");
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  return;
}

Assistant:

void Abc_NtkDeriveFlatGia_rec( Gia_Man_t * pGia, Abc_Ntk_t * pNtk )
{
    int gFanins[16];
    Vec_Ptr_t * vOrder = (Vec_Ptr_t *)pNtk->pData;
    Abc_Obj_t * pObj, * pTerm;
    Abc_Ntk_t * pNtkModel;
    int i, k;
    Abc_NtkForEachPi( pNtk, pTerm, i )
        assert( Abc_ObjFanout0(pTerm)->iTemp >= 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
/*
            int nLength = strlen(pSop);
            if ( nLength == 4 ) // buf/inv
            {
                assert( pSop[2] == '1' );
                assert( pSop[0] == '0' || pSop[0] == '1' );
                assert( Abc_ObjFanin0(pObj)->iTemp >= 0 );
                Abc_ObjFanout0(pObj)->iTemp = Abc_LitNotCond( Abc_ObjFanin0(pObj)->iTemp, pSop[0]=='0' );
                continue;
            }
            if ( nLength == 5 ) // and2
            {
                assert( pSop[3] == '1' );
                assert( pSop[0] == '0' || pSop[0] == '1' );
                assert( pSop[1] == '0' || pSop[1] == '1' );
                assert( Abc_ObjFanin0(pObj)->iTemp >= 0 );
                assert( Abc_ObjFanin1(pObj)->iTemp >= 0 );
                Abc_ObjFanout0(pObj)->iTemp = Gia_ManHashAnd( pGia, 
                    Abc_LitNotCond( Abc_ObjFanin0(pObj)->iTemp, pSop[0]=='0' ),
                    Abc_LitNotCond( Abc_ObjFanin1(pObj)->iTemp, pSop[1]=='0' )
                    );
                continue;
            }
*/
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        Abc_NtkFillTemp( pNtkModel );
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
        assert( Abc_ObjFanin0(pTerm)->iTemp >= 0 );
}